

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O1

void Unit_cmp(void)

{
  unit *puVar1;
  long lVar2;
  
  puVar1 = usp;
  if (UnitsOn != '\x01') {
    return;
  }
  if (unit_stack < usp) {
    if (usp->isnum == 0) {
      if (usp[-1].isnum != 0) {
        *(undefined2 *)(usp[-1].dim + 8) = *(undefined2 *)(usp->dim + 8);
        *(undefined8 *)puVar1[-1].dim = *(undefined8 *)puVar1->dim;
        puVar1[-1].factor = puVar1->factor;
        puVar1[-1].isnum = 0;
      }
      if (((unitonflag != 0) && (puVar1[-1].dim[0] != '\t')) && (puVar1->dim[0] != '\t')) {
        lVar2 = 0;
        do {
          if (puVar1->dim[lVar2 + -0x18] != usp->dim[lVar2]) {
            Unit_cmp_cold_1();
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 10);
        if (1e-05 < ABS(usp->factor / puVar1[-1].factor + -1.0)) {
          Unit_cmp_cold_2();
        }
      }
    }
    unit_pop();
    return;
  }
  __assert_fail("usp > unit_stack",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                ,0x177,"void Unit_cmp()");
}

Assistant:

void Unit_cmp() {
	/*compares top two units on stack. If not conformable then
	gives error. If not same factor then gives error.
	*/
	struct unit *up;
	int i;
	
	IFUNITS
	assert(usp > unit_stack);
	up = usp - 1;
	if (usp->isnum) {
		unit_pop();
		return;
	}
	if (up->isnum) {
		for (i=0; i < NDIM; i++) {
			up->dim[i] = usp->dim[i];
		}
		up->factor = usp->factor;
		up->isnum = 0;
	}
if (unitonflag && up->dim[0] != 9 && usp->dim[0] != 9) {
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			print_unit_expr(2);
			fprintf(stderr, "\nunits:");
			units(usp);
			print_unit_expr(1);
			fprintf(stderr, "\nunits:");
			units(up);
diag("The units of the previous two expressions are not conformable","\n");
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
fprintf(stderr, "The previous primary expression with units: %s\n\
is missing a conversion factor and should read:\n  (%g)*(",
Unit_str(usp), usp->factor/up->factor);
		print_unit_expr(2);
		diag(")\n", (char *)0);
	}
}
	unit_pop();
	return;
}